

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O0

size_t strnappend(char **dest,size_t *dest_allocation,char *source,size_t n)

{
  ulong uVar1;
  char *pcVar2;
  size_t local_48;
  size_t required_allocation;
  size_t source_len;
  size_t n_local;
  char *source_local;
  size_t *dest_allocation_local;
  char **dest_local;
  
  if ((dest == (char **)0x0) || (dest_allocation == (size_t *)0x0)) {
    dest_local = (char **)0xffffffffffffffff;
  }
  else if ((*dest == (char *)0x0) && (*dest_allocation != 0)) {
    dest_local = (char **)0xffffffffffffffff;
  }
  else if (source == (char *)0x0) {
    dest_local = (char **)*dest_allocation;
  }
  else {
    required_allocation = strlen(source);
    if ((n != 0) && (n < required_allocation)) {
      required_allocation = n;
    }
    if (*dest == (char *)0x0) {
      local_48 = 0;
    }
    else {
      local_48 = strlen(*dest);
    }
    uVar1 = local_48 + required_allocation + 1;
    if (*dest_allocation < uVar1) {
      if (*dest_allocation == 0) {
        pcVar2 = (char *)__ckd_calloc__(uVar1 * 2,1,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                                        ,0xb1);
        *dest = pcVar2;
      }
      else {
        pcVar2 = (char *)__ckd_realloc__(*dest,uVar1 * 2,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                                         ,0xb3);
        *dest = pcVar2;
      }
      *dest_allocation = uVar1 * 2;
    }
    strncat(*dest,source,required_allocation);
    dest_local = (char **)*dest_allocation;
  }
  return (size_t)dest_local;
}

Assistant:

static size_t
strnappend(char **dest, size_t *dest_allocation,
       const char *source, size_t n)
{
    size_t source_len, required_allocation;

    if (dest == NULL || dest_allocation == NULL)
        return -1;
    if (*dest == NULL && *dest_allocation != 0)
        return -1;
    if (source == NULL)
        return *dest_allocation;

    source_len = strlen(source);
    if (n && n < source_len)
        source_len = n;

    required_allocation = (*dest ? strlen(*dest) : 0) + source_len + 1;
    if (*dest_allocation < required_allocation) {
        if (*dest_allocation == 0) {
            *dest = (char *)ckd_calloc(required_allocation * 2, 1);
        } else {
            *dest = (char *)ckd_realloc(*dest, required_allocation * 2);
        }
        *dest_allocation = required_allocation * 2;
    }

    strncat(*dest, source, source_len);

    return *dest_allocation;
}